

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffc2d(char *cval,double *dval,int *status)

{
  int iVar1;
  char *outstr;
  uint uVar2;
  char dtype;
  char msg [81];
  char sval [81];
  byte local_d9;
  char local_d8 [96];
  char local_78 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (*cval == '\0') {
    *status = 0xcc;
    return 0xcc;
  }
  ffdtyp(cval,(char *)&local_d9,status);
  switch(local_d9) {
  case 0x43:
    outstr = local_78;
    ffc2s(cval,outstr,status);
    break;
  default:
    *status = 0x196;
    goto LAB_0018718a;
  case 0x46:
  case 0x49:
    outstr = cval;
    break;
  case 0x4c:
    uVar2 = 0;
    if ((*status < 1) && (*cval == 'T')) {
      uVar2 = 0x3ff00000;
    }
    *dval = (double)((ulong)uVar2 << 0x20);
    goto LAB_0018717c;
  }
  ffc2dd(outstr,dval,status);
LAB_0018717c:
  iVar1 = *status;
  if (0 < iVar1) {
LAB_0018718a:
    *dval = 0.0;
    builtin_strncpy(local_d8 + 0x10,"valuating string as a double: ",0x1f);
    builtin_strncpy(local_d8,"Error in ffc2d e",0x10);
    strncat(local_d8,cval,0x1e);
    ffxmsg(5,local_d8);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffc2d(const char *cval,   /* I - string representation of the value */
          double *dval,       /* O - numerical value of the input string */
          int *status)        /* IO - error status */
/*
  convert formatted string to a double value, doing implicit
  datatype conversion if necessary
*/
{
    char dtype, sval[81], msg[81];
    int lval;
    
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == '\0')
        return(*status = VALUE_UNDEFINED);  /* null value string */

    ffdtyp(cval, &dtype, status);     /* determine the datatype */

    if (dtype == 'I' || dtype == 'F')
        ffc2dd(cval, dval, status);
    else if (dtype == 'L')
    {
        ffc2ll(cval, &lval, status);
        *dval = (double) lval;
    }
    else if (dtype == 'C')
    {
        /* try reading the string as a number */
        ffc2s(cval, sval, status); 
        ffc2dd(sval, dval, status);
    }
    else 
        *status = BAD_DOUBLEKEY;

    if (*status > 0)
    {
            *dval = 0.;
            strcpy(msg,"Error in ffc2d evaluating string as a double: ");
            strncat(msg,cval,30);
            ffpmsg(msg);
            return(*status);
    }

    return(*status);
}